

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileContainingExtension
          (MergedDescriptorDatabase *this,StringViewArg containing_type,int field_number,
          FileDescriptorProto *output)

{
  pointer ppDVar1;
  DescriptorDatabase *pDVar2;
  int iVar3;
  ulong unaff_RBP;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  FileDescriptorProto temp;
  FileDescriptorProto local_128;
  
  ppDVar1 = (this->sources_).
            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar6 = (this->sources_).
          super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppDVar1;
  if (bVar6) {
    unaff_RBP = (ulong)(uint)field_number;
    iVar3 = (*(*ppDVar1)->_vptr_DescriptorDatabase[4])();
    if ((char)iVar3 == '\0') {
      uVar5 = 1;
      do {
        uVar4 = uVar5;
        ppDVar1 = (this->sources_).
                  super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar6 = uVar4 < (ulong)((long)(this->sources_).
                                      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >>
                               3);
        if (!bVar6) goto LAB_003ea555;
        pDVar2 = ppDVar1[uVar4];
        iVar3 = (*pDVar2->_vptr_DescriptorDatabase[4])(pDVar2,containing_type,unaff_RBP,output);
        uVar5 = uVar4 + 1;
      } while ((char)iVar3 == '\0');
    }
    else {
      uVar4 = 0;
    }
    FileDescriptorProto::FileDescriptorProto(&local_128,(Arena *)0x0);
    unaff_RBP = (ulong)(uVar4 == 0);
    if (uVar4 != 0) {
      uVar5 = 1;
      do {
        pDVar2 = (this->sources_).
                 super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5 - 1];
        iVar3 = (*pDVar2->_vptr_DescriptorDatabase[2])
                          (pDVar2,(ulong)(output->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                                  0xfffffffffffffffc,&local_128);
        if ((char)iVar3 != '\0') break;
        unaff_RBP = (ulong)(uVar4 <= uVar5);
        bVar7 = uVar5 != uVar4;
        uVar5 = uVar5 + 1;
      } while (bVar7);
    }
    FileDescriptorProto::~FileDescriptorProto(&local_128);
  }
LAB_003ea555:
  return (bool)(bVar6 & (byte)unaff_RBP);
}

Assistant:

EncodedDescriptorDatabase::~EncodedDescriptorDatabase() {
  for (void* p : files_to_delete_) {
    operator delete(p);
  }
}